

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFLogger.cc
# Opt level: O1

void __thiscall QPDFLogger::setError(QPDFLogger *this,shared_ptr<Pipeline> *p)

{
  element_type *peVar1;
  
  if ((p->super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>)._M_ptr == (element_type *)0x0) {
    peVar1 = (this->m).super___shared_ptr<QPDFLogger::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (p->super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
         (peVar1->p_stderr).super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&(p->super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>)._M_refcount,
               &(peVar1->p_stderr).super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  peVar1 = (this->m).super___shared_ptr<QPDFLogger::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (peVar1->p_error).super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (p->super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(peVar1->p_error).super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_refcount
             ,&(p->super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>)._M_refcount);
  return;
}

Assistant:

void
QPDFLogger::setError(std::shared_ptr<Pipeline> p)
{
    if (p == nullptr) {
        p = m->p_stderr;
    }
    m->p_error = p;
}